

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O0

void cio_linux_eventloop_remove(cio_eventloop *loop,cio_event_notifier *evn)

{
  cio_event_notifier *evn_local;
  cio_eventloop *loop_local;
  
  epoll_ctl(loop->epoll_fd,2,evn->fd,(epoll_event *)0x0);
  erase_pending_event(loop,evn);
  if (loop->current_ev == evn) {
    loop->current_ev = (cio_event_notifier *)0x0;
  }
  return;
}

Assistant:

void cio_linux_eventloop_remove(struct cio_eventloop *loop, const struct cio_event_notifier *evn)
{
	epoll_ctl(loop->epoll_fd, EPOLL_CTL_DEL, evn->fd, NULL);
	erase_pending_event(loop, evn);
	if (loop->current_ev == evn) {
		loop->current_ev = NULL;
	}
}